

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# http_proxy.c
# Opt level: O3

CURLcode http_proxy_cf_connect(Curl_cfilter *cf,Curl_easy *data,_Bool *done)

{
  long *plVar1;
  curl_trc_feat *pcVar2;
  Curl_cfilter *pCVar3;
  _Bool _Var4;
  CURLcode CVar5;
  CURLcode CVar6;
  byte bVar7;
  
  if ((cf->field_0x24 & 1) == 0) {
    plVar1 = (long *)cf->ctx;
    if ((((data != (Curl_easy *)0x0) && (((data->set).field_0x89f & 0x40) != 0)) &&
        ((pcVar2 = (data->state).feat, pcVar2 == (curl_trc_feat *)0x0 || (0 < pcVar2->log_level))))
       && (0 < cf->cft->log_level)) {
      Curl_trc_cf_infof(data,cf,"connect");
    }
    CVar5 = (*(code *)cf->next->cft->do_connect)(cf->next,data,done);
    if (CVar5 == CURLE_OK) {
      CVar5 = CURLE_OK;
      while (*done == true) {
        *done = false;
        if (*plVar1 != 0) {
          cf->field_0x24 = cf->field_0x24 | 1;
          *done = true;
          return CURLE_OK;
        }
        _Var4 = Curl_conn_cf_is_ssl(cf->next);
        bVar7 = 2;
        if (_Var4) {
          bVar7 = cf->conn->proxy_alpn;
          if (2 < bVar7) {
            if (data == (Curl_easy *)0x0) {
              return CURLE_COULDNT_CONNECT;
            }
            if (((data->set).field_0x89f & 0x40) == 0) {
              return CURLE_COULDNT_CONNECT;
            }
            pcVar2 = (data->state).feat;
            if ((pcVar2 != (curl_trc_feat *)0x0) && (pcVar2->log_level < 1)) {
              return CURLE_COULDNT_CONNECT;
            }
            Curl_infof(data,"CONNECT tunnel: unsupported ALPN(%d) negotiated",(ulong)(uint)bVar7);
            return CURLE_COULDNT_CONNECT;
          }
        }
        if ((((data != (Curl_easy *)0x0) && (((data->set).field_0x89f & 0x40) != 0)) &&
            (((pcVar2 = (data->state).feat, pcVar2 != (curl_trc_feat *)0x0 &&
              (pcVar2->log_level < 1)) ||
             ((cf->cft->log_level < 1 ||
              (Curl_trc_cf_infof(data,cf,"installing subfilter for HTTP/1.1"),
              ((data->set).field_0x89f & 0x40) != 0)))))) &&
           ((pcVar2 = (data->state).feat, pcVar2 == (curl_trc_feat *)0x0 || (0 < pcVar2->log_level))
           )) {
          Curl_infof(data,"CONNECT tunnel: HTTP/1.%d negotiated",(ulong)(bVar7 != 1));
        }
        CVar6 = Curl_cf_h1_proxy_insert_after(cf,data);
        if (CVar6 != CURLE_OK) {
          return CVar6;
        }
        pCVar3 = cf->next;
        *plVar1 = (long)pCVar3;
        *(uint *)(plVar1 + 1) = bVar7 == 1 ^ 0xb;
        CVar6 = (*(code *)pCVar3->cft->do_connect)(pCVar3,data,done);
        if (CVar6 != CURLE_OK) {
          return CVar6;
        }
      }
    }
  }
  else {
    *done = true;
    CVar5 = CURLE_OK;
  }
  return CVar5;
}

Assistant:

static CURLcode http_proxy_cf_connect(struct Curl_cfilter *cf,
                                      struct Curl_easy *data,
                                      bool *done)
{
  struct cf_proxy_ctx *ctx = cf->ctx;
  CURLcode result;

  if(cf->connected) {
    *done = TRUE;
    return CURLE_OK;
  }

  CURL_TRC_CF(data, cf, "connect");
connect_sub:
  result = cf->next->cft->do_connect(cf->next, data, done);
  if(result || !*done)
    return result;

  *done = FALSE;
  if(!ctx->cf_protocol) {
    struct Curl_cfilter *cf_protocol = NULL;
    int httpversion = 0;
    int alpn = Curl_conn_cf_is_ssl(cf->next) ?
      cf->conn->proxy_alpn : CURL_HTTP_VERSION_1_1;

    /* First time call after the subchain connected */
    switch(alpn) {
    case CURL_HTTP_VERSION_NONE:
    case CURL_HTTP_VERSION_1_0:
    case CURL_HTTP_VERSION_1_1:
      CURL_TRC_CF(data, cf, "installing subfilter for HTTP/1.1");
      infof(data, "CONNECT tunnel: HTTP/1.%d negotiated",
            (alpn == CURL_HTTP_VERSION_1_0) ? 0 : 1);
      result = Curl_cf_h1_proxy_insert_after(cf, data);
      if(result)
        goto out;
      cf_protocol = cf->next;
      httpversion = (alpn == CURL_HTTP_VERSION_1_0) ? 10 : 11;
      break;
#ifdef USE_NGHTTP2
    case CURL_HTTP_VERSION_2:
      CURL_TRC_CF(data, cf, "installing subfilter for HTTP/2");
      infof(data, "CONNECT tunnel: HTTP/2 negotiated");
      result = Curl_cf_h2_proxy_insert_after(cf, data);
      if(result)
        goto out;
      cf_protocol = cf->next;
      httpversion = 20;
      break;
#endif
    default:
      infof(data, "CONNECT tunnel: unsupported ALPN(%d) negotiated", alpn);
      result = CURLE_COULDNT_CONNECT;
      goto out;
    }

    ctx->cf_protocol = cf_protocol;
    ctx->httpversion = httpversion;
    /* after we installed the filter "below" us, we call connect
     * on out sub-chain again.
     */
    goto connect_sub;
  }
  else {
    /* subchain connected and we had already installed the protocol filter.
     * This means the protocol tunnel is established, we are done.
     */
    DEBUGASSERT(ctx->cf_protocol);
    result = CURLE_OK;
  }

out:
  if(!result) {
    cf->connected = TRUE;
    *done = TRUE;
  }
  return result;
}